

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

ssize_t __thiscall
kj::anon_unknown_31::WebSocketPipeImpl::send
          (WebSocketPipeImpl *this,int __fd,void *__buf,size_t __n,int __flags)

{
  undefined4 in_register_00000034;
  WebSocketPipeImpl *adapterConstructorParams;
  OneOf<kj::ArrayPtr<const_char>,_kj::ArrayPtr<const_unsigned_char>,_kj::(anonymous_namespace)::WebSocketPipeImpl::ClosePtr>
  local_60;
  WebSocketPipeImpl *local_40;
  char *local_38;
  WebSocket *local_30;
  WebSocket *s;
  WebSocketPipeImpl *this_local;
  ArrayPtr<const_char> message_local;
  
  adapterConstructorParams = (WebSocketPipeImpl *)CONCAT44(in_register_00000034,__fd);
  s = (WebSocket *)adapterConstructorParams;
  this_local = (WebSocketPipeImpl *)__buf;
  message_local.ptr = (char *)__n;
  message_local.size_ = (size_t)this;
  local_30 = _::readMaybe<kj::WebSocket>(&adapterConstructorParams->state);
  if (local_30 == (WebSocket *)0x0) {
    OneOf<kj::ArrayPtr<char_const>,kj::ArrayPtr<unsigned_char_const>,kj::(anonymous_namespace)::WebSocketPipeImpl::ClosePtr>
    ::OneOf<kj::ArrayPtr<char_const>&>
              ((OneOf<kj::ArrayPtr<char_const>,kj::ArrayPtr<unsigned_char_const>,kj::(anonymous_namespace)::WebSocketPipeImpl::ClosePtr>
                *)&local_60,(ArrayPtr<const_char> *)&this_local);
    newAdaptedPromise<void,kj::(anonymous_namespace)::WebSocketPipeImpl::BlockedSend,kj::(anonymous_namespace)::WebSocketPipeImpl&,kj::OneOf<kj::ArrayPtr<char_const>,kj::ArrayPtr<unsigned_char_const>,kj::(anonymous_namespace)::WebSocketPipeImpl::ClosePtr>>
              ((kj *)this,adapterConstructorParams,&local_60);
    OneOf<kj::ArrayPtr<const_char>,_kj::ArrayPtr<const_unsigned_char>,_kj::(anonymous_namespace)::WebSocketPipeImpl::ClosePtr>
    ::~OneOf(&local_60);
  }
  else {
    local_40 = this_local;
    local_38 = message_local.ptr;
    (*local_30->_vptr_WebSocket[1])(this,local_30,this_local,message_local.ptr);
  }
  return (ssize_t)this;
}

Assistant:

kj::Promise<void> send(kj::ArrayPtr<const char> message) override {
    KJ_IF_MAYBE(s, state) {
      return s->send(message);
    } else {
      return newAdaptedPromise<void, BlockedSend>(*this, MessagePtr(message));
    }
  }